

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btOverlappingPairCache.h
# Opt level: O2

bool __thiscall
btHashedOverlappingPairCache::needsBroadphaseCollision
          (btHashedOverlappingPairCache *this,btBroadphaseProxy *proxy0,btBroadphaseProxy *proxy1)

{
  int iVar1;
  
  if (this->m_overlapFilterCallback != (btOverlapFilterCallback *)0x0) {
    iVar1 = (*this->m_overlapFilterCallback->_vptr_btOverlapFilterCallback[2])();
    return SUB41(iVar1,0);
  }
  if ((ushort)(proxy0->m_collisionFilterGroup & proxy1->m_collisionFilterMask) != 0) {
    return (ushort)(proxy1->m_collisionFilterGroup & proxy0->m_collisionFilterMask) != 0;
  }
  return false;
}

Assistant:

SIMD_FORCE_INLINE bool needsBroadphaseCollision(btBroadphaseProxy* proxy0,btBroadphaseProxy* proxy1) const
	{
		if (m_overlapFilterCallback)
			return m_overlapFilterCallback->needBroadphaseCollision(proxy0,proxy1);

		bool collides = (proxy0->m_collisionFilterGroup & proxy1->m_collisionFilterMask) != 0;
		collides = collides && (proxy1->m_collisionFilterGroup & proxy0->m_collisionFilterMask);
		
		return collides;
	}